

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  Vec_Int_t *p_00;
  ushort uVar1;
  int iVar2;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar3;
  int *piVar4;
  Wlc_Ntk_t *pNew;
  int iVar5;
  long lVar6;
  
  p_01 = vNodesInit;
  if ((vNodesInit == (Vec_Int_t *)0x0) &&
     (p_01 = Wlc_NtkCollectMultipliers(p), p_01 == (Vec_Int_t *)0x0)) {
    pNew = (Wlc_Ntk_t *)0x0;
  }
  else {
    for (iVar5 = 0; iVar5 < p_01->nSize; iVar5 = iVar5 + 1) {
      iVar2 = Vec_IntEntry(p_01,iVar5);
      pWVar3 = Wlc_NtkObj(p,iVar2);
      *(byte *)pWVar3 = *(byte *)pWVar3 | 0x80;
    }
    p_00 = &p->vCopies;
    Vec_IntFill(p_00,p->nObjsAlloc,0);
    for (iVar5 = 1; (iVar5 < p->iObj && (pWVar3 = Wlc_NtkObj(p,iVar5), iVar5 != (p->vCopies).nSize))
        ; iVar5 = iVar5 + 1) {
      uVar1 = *(ushort *)pWVar3;
      if ((char)uVar1 < '\0') {
        *(ushort *)pWVar3 = uVar1 & 0xff7f;
        iVar2 = Wlc_ObjAlloc(p,1,uVar1 >> 6 & 1,pWVar3->End - pWVar3->Beg,0);
      }
      else {
        for (lVar6 = 0; iVar2 = iVar5, lVar6 < (int)pWVar3->nFanins; lVar6 = lVar6 + 1) {
          iVar2 = Wlc_ObjFaninId(pWVar3,(int)lVar6);
          iVar2 = Vec_IntEntry(p_00,iVar2);
          piVar4 = Wlc_ObjFanins(pWVar3);
          piVar4[lVar6] = iVar2;
        }
      }
      Vec_IntWriteEntry(p_00,iVar5,iVar2);
    }
    if (p_01 != vNodesInit) {
      Vec_IntFree(p_01);
    }
    pNew = Wlc_NtkDupDfs(p);
    Wlc_NtkTransferNames(pNew,p);
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}